

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.h
# Opt level: O0

void restore_extra_coding_context(AV1_COMP *cpi)

{
  long *in_RDI;
  AV1_COMMON *cm;
  CODING_CONTEXT *cc;
  CdefInfo *src;
  CdefInfo *dst;
  
  dst = (CdefInfo *)(in_RDI + 0xc055);
  src = (CdefInfo *)(in_RDI + 0x77f0);
  memcpy(in_RDI + 0x832e,dst,0x30);
  restore_cdef_coding_context(dst,src);
  memcpy(in_RDI + 0xc0ee,&dst[1].allocated_num_workers,0x140);
  memcpy((void *)(*in_RDI + 0x12360),&dst[3].srcbuf,0x4c);
  return;
}

Assistant:

static inline void restore_extra_coding_context(AV1_COMP *cpi) {
  CODING_CONTEXT *const cc = &cpi->coding_context;
  AV1_COMMON *cm = &cpi->common;
  cm->lf = cc->lf;
  restore_cdef_coding_context(&cm->cdef_info, &cc->cdef_info);
  cpi->rc = cc->rc;
  cpi->ppi->mv_stats = cc->mv_stats;
}